

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O2

void __thiscall
icu_63::RBBINode::findNodes(RBBINode *this,UVector *dest,NodeType kind,UErrorCode *status)

{
  do {
    if (U_ZERO_ERROR < *status) {
      return;
    }
    if (this->fType == kind) {
      UVector::addElement(dest,this,status);
    }
    if (this->fLeftChild != (RBBINode *)0x0) {
      findNodes(this->fLeftChild,dest,kind,status);
    }
    this = this->fRightChild;
  } while (this != (RBBINode *)0x0);
  return;
}

Assistant:

void   RBBINode::findNodes(UVector *dest, RBBINode::NodeType kind, UErrorCode &status) {
    /* test for buffer overflows */
    if (U_FAILURE(status)) {
        return;
    }
    if (fType == kind) {
        dest->addElement(this, status);
    }
    if (fLeftChild != NULL) {
        fLeftChild->findNodes(dest, kind, status);
    }
    if (fRightChild != NULL) {
        fRightChild->findNodes(dest, kind, status);
    }
}